

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

float * FAudio_INTERNAL_ProcessEffectChain(FAudioVoice *voice,float *buffer,uint32_t *samples)

{
  ulong uVar1;
  float *pfVar2;
  uint32_t samples_00;
  uint *in_RDX;
  float *in_RSI;
  long *in_RDI;
  FAPOProcessBufferParameters dstParams;
  FAPOProcessBufferParameters srcParams;
  FAPO *fapo;
  uint32_t i;
  undefined1 local_48 [4];
  undefined4 uVar3;
  uint uVar4;
  undefined1 local_38 [8];
  undefined4 local_30;
  uint local_2c;
  long local_28;
  uint local_1c;
  uint *local_18;
  float *local_10;
  long *local_8;
  
  local_30 = 0;
  uVar4 = *in_RDX;
  local_1c = 0;
  do {
    if (uVar4 <= local_1c) {
LAB_00130975:
      uVar3 = 1;
      _local_48 = in_RSI;
      local_2c = uVar4;
      local_18 = in_RDX;
      local_10 = in_RSI;
      local_8 = in_RDI;
      for (local_1c = 0; pfVar2 = _local_48, local_1c < *(uint *)((long)local_8 + 0x4c);
          local_1c = local_1c + 1) {
        local_28 = *(long *)(local_8[10] + (ulong)local_1c * 0x10);
        if (*(char *)(local_8[0xe] + (ulong)local_1c) == '\0') {
          if (_local_48 == local_10) {
            uVar1 = (ulong)_local_48 >> 0x20;
            samples_00 = (uint32_t)uVar1;
            _local_48 = pfVar2;
            FAudio_INTERNAL_ResizeEffectChainCache((FAudio *)CONCAT44(uVar4,uVar3),samples_00);
            _local_48 = *(float **)(*local_8 + 0xb0);
          }
          else {
            _local_48 = local_10;
          }
          SDL_memset(_local_48,0,
                     (ulong)(*(int *)(local_8[10] + (ulong)local_1c * 0x10 + 0xc) * local_2c) << 2);
        }
        if (*(char *)(local_8[0xd] + (ulong)local_1c) != '\0') {
          (**(code **)(local_28 + 0x60))
                    (local_28,*(undefined8 *)(local_8[0xb] + (ulong)local_1c * 8),
                     *(undefined4 *)(local_8[0xc] + (ulong)local_1c * 4));
          *(undefined1 *)(local_8[0xd] + (ulong)local_1c) = 0;
        }
        (**(code **)(local_28 + 0x48))
                  (local_28,1,local_38,1,local_48,
                   *(undefined4 *)(local_8[10] + (ulong)local_1c * 0x10 + 8));
        SDL_memcpy(local_38,local_48,0x10);
      }
      *local_18 = uVar4;
      *(undefined4 *)(local_8 + 9) = uVar3;
      return _local_48;
    }
    if ((in_RSI[local_1c] != 0.0) || (NAN(in_RSI[local_1c]))) {
      local_30 = 1;
      goto LAB_00130975;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static inline float *FAudio_INTERNAL_ProcessEffectChain(
	FAudioVoice *voice,
	float *buffer,
	uint32_t *samples
) {
	uint32_t i;
	FAPO *fapo;
	FAPOProcessBufferParameters srcParams, dstParams;

	LOG_FUNC_ENTER(voice->audio)

	/* Set up the buffer to be written into */
	srcParams.pBuffer = buffer;
	srcParams.BufferFlags = FAPO_BUFFER_SILENT;
	srcParams.ValidFrameCount = *samples;
	for (i = 0; i < srcParams.ValidFrameCount; i += 1)
	{
		if (buffer[i] != 0.0f) /* Arbitrary! */
		{
			srcParams.BufferFlags = FAPO_BUFFER_VALID;
			break;
		}
	}

	/* Initialize output parameters to something sane */
	dstParams.pBuffer = srcParams.pBuffer;
	dstParams.BufferFlags = FAPO_BUFFER_VALID;
	dstParams.ValidFrameCount = srcParams.ValidFrameCount;

	/* Update parameters, process! */
	for (i = 0; i < voice->effects.count; i += 1)
	{
		fapo = voice->effects.desc[i].pEffect;

		if (!voice->effects.inPlaceProcessing[i])
		{
			if (dstParams.pBuffer == buffer)
			{
				FAudio_INTERNAL_ResizeEffectChainCache(
					voice->audio,
					voice->effects.desc[i].OutputChannels * srcParams.ValidFrameCount
				);
				dstParams.pBuffer = voice->audio->effectChainCache;
			}
			else
			{
				/* FIXME: What if this is smaller because
				 * inputChannels < desc[i].OutputChannels?
				 */
				dstParams.pBuffer = buffer;
			}

			FAudio_zero(
				dstParams.pBuffer,
				voice->effects.desc[i].OutputChannels * srcParams.ValidFrameCount * sizeof(float)
			);
		}

		if (voice->effects.parameterUpdates[i])
		{
			fapo->SetParameters(
				fapo,
				voice->effects.parameters[i],
				voice->effects.parameterSizes[i]
			);
			voice->effects.parameterUpdates[i] = 0;
		}

		fapo->Process(
			fapo,
			1,
			&srcParams,
			1,
			&dstParams,
			voice->effects.desc[i].InitialState
		);

		FAudio_memcpy(&srcParams, &dstParams, sizeof(dstParams));
	}

	*samples = dstParams.ValidFrameCount;

	/* Save the output buffer-flags so the mixer-function can determine when it's save to stop processing the effect chain */
	voice->effects.state = dstParams.BufferFlags;

	LOG_FUNC_EXIT(voice->audio)
	return (float*) dstParams.pBuffer;
}